

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::LinearQuantizationParams::SerializeWithCachedSizes
          (LinearQuantizationParams *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  float *pfVar8;
  
  if (0 < (this->scale_).current_size_) {
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
    }
    else {
      *output->buffer_ = '\n';
      output->buffer_ = output->buffer_ + 1;
      output->buffer_size_ = output->buffer_size_ + -1;
    }
    uVar7 = this->_scale_cached_byte_size_;
    if (output->buffer_size_ < 5) {
      google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
    }
    else {
      pbVar1 = output->buffer_;
      pbVar5 = pbVar1;
      uVar6 = uVar7;
      if (0x7f < uVar7) {
        do {
          *pbVar5 = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          pbVar5 = pbVar5 + 1;
          bVar3 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar3);
      }
      *pbVar5 = (byte)uVar6;
      iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
      output->buffer_ = output->buffer_ + iVar4;
      output->buffer_size_ = output->buffer_size_ - iVar4;
    }
    pRVar2 = (this->scale_).rep_;
    pfVar8 = pRVar2->elements;
    if (pRVar2 == (Rep *)0x0) {
      pfVar8 = (float *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteFloatArray
              (pfVar8,(this->scale_).current_size_,output);
  }
  if ((this->bias_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x12);
  }
  else {
    *output->buffer_ = '\x12';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  uVar7 = this->_bias_cached_byte_size_;
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,uVar7);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = uVar7;
    if (0x7f < uVar7) {
      do {
        *pbVar5 = (byte)uVar7 | 0x80;
        uVar6 = uVar7 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < uVar7;
        uVar7 = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  pRVar2 = (this->bias_).rep_;
  pfVar8 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    pfVar8 = (float *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteFloatArray
            (pfVar8,(this->bias_).current_size_,output);
  return;
}

Assistant:

void LinearQuantizationParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.LinearQuantizationParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated float scale = 1;
  if (this->scale_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scale_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->scale().data(), this->scale_size(), output);
  }

  // repeated float bias = 2;
  if (this->bias_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_bias_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteFloatArray(
      this->bias().data(), this->bias_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.LinearQuantizationParams)
}